

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O1

void ext_loader_impl_destroy_handle(loader_impl_ext_handle ext_handle)

{
  pointer plVar1;
  pointer pcVar2;
  pointer plVar3;
  loader_impl_ext_handle_lib_type ext;
  long *local_58 [2];
  long local_48 [2];
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  plVar3 = (ext_handle->extensions).
           super__Vector_base<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  plVar1 = (ext_handle->extensions).
           super__Vector_base<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (plVar3 != plVar1) {
    do {
      pcVar2 = (plVar3->name)._M_dataplus._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar2,pcVar2 + (plVar3->name)._M_string_length);
      local_38 = *(undefined4 *)&plVar3->handle;
      uStack_34 = *(undefined4 *)((long)&plVar3->handle + 4);
      uStack_30 = *(undefined4 *)&plVar3->addr;
      uStack_2c = *(undefined4 *)((long)&plVar3->addr + 4);
      if (plVar3->handle != (dynlink)0x0) {
        dynlink_unload();
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      plVar3 = plVar3 + 1;
    } while (plVar3 != plVar1);
  }
  std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>::
  ~vector(&ext_handle->extensions);
  operator_delete(ext_handle,0x18);
  return;
}

Assistant:

void ext_loader_impl_destroy_handle(loader_impl_ext_handle ext_handle)
{
	for (auto ext : ext_handle->extensions)
	{
		if (ext.handle != NULL)
		{
			dynlink_unload(ext.handle);
		}
	}

	delete ext_handle;
}